

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)8>_> * __thiscall
vkt::pipeline::anon_unknown_0::TimestampTestInstance::createBufferAndBindMemory
          (Move<vk::Handle<(vk::HandleType)8>_> *__return_storage_ptr__,TimestampTestInstance *this,
          VkDeviceSize size,VkBufferUsageFlags usage,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc)

{
  deUint64 dVar1;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device;
  InstanceInterface *vk_01;
  VkPhysicalDevice physicalDevice;
  Handle<(vk::HandleType)8> *pHVar2;
  Allocation *pAVar3;
  VkDeviceMemory VVar4;
  VkDeviceSize VVar5;
  VkMemoryRequirements local_4e8;
  undefined1 local_4d0 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferAlloc;
  undefined1 local_4a8 [8];
  VkBufferCreateInfo vertexBufferParams;
  undefined1 local_268 [8];
  SimpleAllocator memAlloc;
  deUint32 queueFamilyIndex;
  VkDevice vkDevice;
  DeviceInterface *vk;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc_local;
  VkBufferUsageFlags usage_local;
  VkDeviceSize size_local;
  TimestampTestInstance *this_local;
  Move<vk::Handle<(vk::HandleType)8>_> *vertexBuffer;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  memAlloc.m_memProps.memoryHeaps[0xf]._12_4_ =
       Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk_01 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&vertexBufferParams.pQueueFamilyIndices,vk_01,
             physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_268,vk_00,device,
             (VkPhysicalDeviceMemoryProperties *)&vertexBufferParams.pQueueFamilyIndices);
  local_4a8._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vertexBufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexBufferParams._4_4_ = 0;
  vertexBufferParams.pNext._0_4_ = 0;
  vertexBufferParams.size._4_4_ = 0;
  vertexBufferParams.usage = 1;
  vertexBufferParams._40_8_ = &memAlloc.m_memProps.memoryHeaps[0xf].field_0xc;
  vertexBufferParams._16_8_ = size;
  vertexBufferParams.size._0_4_ = usage;
  ::vk::createBuffer(__return_storage_ptr__,vk_00,device,(VkBufferCreateInfo *)local_4a8,
                     (VkAllocationCallbacks *)0x0);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::getBufferMemoryRequirements(&local_4e8,vk_00,device,(VkBuffer)pHVar2->m_internal);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4d0,
             (SimpleAllocator *)local_268,&local_4e8,::vk::MemoryRequirement::HostVisible);
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  dVar1 = pHVar2->m_internal;
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4d0);
  VVar4 = ::vk::Allocation::getMemory(pAVar3);
  pAVar3 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4d0);
  VVar5 = ::vk::Allocation::getOffset(pAVar3);
  result = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device,dVar1,VVar4.m_internal,VVar5);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x356);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (pAlloc,(MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4d0);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_4d0);
  ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_268);
  return __return_storage_ptr__;
}

Assistant:

Move<VkBuffer> TimestampTestInstance::createBufferAndBindMemory(VkDeviceSize size, VkBufferUsageFlags usage, de::MovePtr<Allocation>* pAlloc)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();
	const VkDevice              vkDevice            = m_context.getDevice();
	const deUint32              queueFamilyIndex    = m_context.getUniversalQueueFamilyIndex();
	SimpleAllocator             memAlloc            (vk, vkDevice, getPhysicalDeviceMemoryProperties(m_context.getInstanceInterface(), m_context.getPhysicalDevice()));

	const VkBufferCreateInfo vertexBufferParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,       // VkStructureType      sType;
		DE_NULL,                                    // const void*          pNext;
		0u,                                         // VkBufferCreateFlags  flags;
		size,                                       // VkDeviceSize         size;
		usage,                                      // VkBufferUsageFlags   usage;
		VK_SHARING_MODE_EXCLUSIVE,                  // VkSharingMode        sharingMode;
		1u,                                         // deUint32             queueFamilyCount;
		&queueFamilyIndex                           // const deUint32*      pQueueFamilyIndices;
	};

	Move<VkBuffer> vertexBuffer = createBuffer(vk, vkDevice, &vertexBufferParams);
	de::MovePtr<Allocation> vertexBufferAlloc = memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible);

	VK_CHECK(vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferAlloc->getMemory(), vertexBufferAlloc->getOffset()));

	DE_ASSERT(pAlloc);
	*pAlloc = vertexBufferAlloc;

	return vertexBuffer;
}